

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

int VP8DecodeMB(VP8Decoder *dec,VP8BitReader *token_br)

{
  long lVar1;
  undefined1 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  long in_RSI;
  long in_RDI;
  VP8FInfo *finfo;
  int skip;
  VP8MBData *block;
  VP8MB *mb;
  VP8MB *left;
  VP8BitReader *in_stack_00000070;
  VP8MB *in_stack_00000078;
  VP8Decoder *in_stack_00000080;
  uint local_3c;
  uint local_2c;
  
  lVar1 = *(long *)(in_RDI + 0xb10);
  puVar2 = (undefined1 *)(*(long *)(in_RDI + 0xb10) + (long)*(int *)(in_RDI + 0xb58) * 2);
  lVar3 = *(long *)(in_RDI + 0xb60) + (long)*(int *)(in_RDI + 0xb58) * 800;
  if (*(int *)(in_RDI + 0xaf0) == 0) {
    local_3c = 0;
  }
  else {
    local_3c = (uint)*(byte *)(lVar3 + 0x31d);
  }
  local_2c = local_3c;
  if (local_3c == 0) {
    local_2c = ParseResiduals(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  }
  else {
    *puVar2 = 0;
    *(undefined1 *)(lVar1 + -2) = 0;
    if (*(char *)(lVar3 + 0x300) == '\0') {
      puVar2[1] = 0;
      *(undefined1 *)(lVar1 + -1) = 0;
    }
    *(undefined4 *)(lVar3 + 0x314) = 0;
    *(undefined4 *)(lVar3 + 0x318) = 0;
    *(undefined1 *)(lVar3 + 0x31c) = 0;
  }
  if (0 < *(int *)(in_RDI + 0xb68)) {
    puVar4 = (undefined4 *)(*(long *)(in_RDI + 0xb18) + (long)*(int *)(in_RDI + 0xb58) * 4);
    *puVar4 = *(undefined4 *)
               (in_RDI + 0xb6c + (ulong)*(byte *)(lVar3 + 0x31e) * 8 +
               (ulong)*(byte *)(lVar3 + 0x300) * 4);
    *(byte *)((long)puVar4 + 2) = *(byte *)((long)puVar4 + 2) | (local_2c != 0 ^ 0xffU) & 1;
  }
  return (int)((*(int *)(in_RSI + 0x28) != 0 ^ 0xffU) & 1);
}

Assistant:

int VP8DecodeMB(VP8Decoder* const dec, VP8BitReader* const token_br) {
  VP8MB* const left = dec->mb_info_ - 1;
  VP8MB* const mb = dec->mb_info_ + dec->mb_x_;
  VP8MBData* const block = dec->mb_data_ + dec->mb_x_;
  int skip = dec->use_skip_proba_ ? block->skip_ : 0;

  if (!skip) {
    skip = ParseResiduals(dec, mb, token_br);
  } else {
    left->nz_ = mb->nz_ = 0;
    if (!block->is_i4x4_) {
      left->nz_dc_ = mb->nz_dc_ = 0;
    }
    block->non_zero_y_ = 0;
    block->non_zero_uv_ = 0;
    block->dither_ = 0;
  }

  if (dec->filter_type_ > 0) {  // store filter info
    VP8FInfo* const finfo = dec->f_info_ + dec->mb_x_;
    *finfo = dec->fstrengths_[block->segment_][block->is_i4x4_];
    finfo->f_inner_ |= !skip;
  }

  return !token_br->eof_;
}